

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O1

bool __thiscall rw::Clump::streamWrite(Clump *this,Stream *stream)

{
  LinkList *pLVar1;
  LinkList *pLVar2;
  LLLink *pLVar3;
  Clump *object;
  uint32 uVar4;
  int32 iVar5;
  LLLink *pLVar6;
  int val;
  int size;
  FrameList_ frmlst;
  int32 buf [3];
  FrameList_ local_60;
  LLLink *local_50;
  Clump *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar4 = streamGetSize(this);
  writeChunkHeader(stream,0x10,uVar4);
  pLVar1 = &this->atomics;
  val = -1;
  pLVar6 = &pLVar1->link;
  do {
    pLVar6 = ((LLLink *)&pLVar6->next)->next;
    val = val + 1;
  } while (pLVar6 != &pLVar1->link);
  pLVar2 = &this->lights;
  local_38 = -1;
  pLVar6 = &pLVar2->link;
  do {
    pLVar6 = ((LLLink *)&pLVar6->next)->next;
    local_38 = local_38 + 1;
  } while (pLVar6 != &pLVar2->link);
  local_50 = &(this->cameras).link;
  local_34 = -1;
  pLVar6 = local_50;
  do {
    pLVar6 = ((LLLink *)&pLVar6->next)->next;
    local_34 = local_34 + 1;
  } while (pLVar6 != local_50);
  uVar4 = (uint)(0x33000 < version) * 8 + 4;
  local_3c = val;
  writeChunkHeader(stream,1,uVar4);
  Stream::write32(stream,&local_3c,uVar4);
  local_60.numFrames = Frame::count((Frame *)(this->object).parent);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp line: 302"
  ;
  local_60.frames = (Frame **)(*Engine::memfuncs)((long)local_60.numFrames << 3,0x10010);
  local_48 = this;
  makeFrameList((Frame *)(this->object).parent,local_60.frames);
  FrameList_::streamWrite(&local_60,stream);
  if (0x303ff < version) {
    pLVar6 = (pLVar1->link).next;
    size = 0x10;
    while (pLVar6 != &pLVar1->link) {
      pLVar3 = pLVar6 + -3;
      pLVar6 = pLVar6->next;
      uVar4 = Geometry::streamGetSize((Geometry *)pLVar3->next);
      size = size + uVar4 + 0xc;
    }
    writeChunkHeader(stream,0x1a,size);
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,val);
    pLVar6 = (pLVar1->link).next;
    while (pLVar6 != &pLVar1->link) {
      pLVar3 = pLVar6 + -3;
      pLVar6 = pLVar6->next;
      Geometry::streamWrite((Geometry *)pLVar3->next,stream);
    }
  }
  pLVar6 = (pLVar1->link).next;
  if (pLVar6 != &pLVar1->link) {
    do {
      pLVar3 = pLVar6->next;
      Atomic::streamWriteClump((Atomic *)&pLVar6[-6].prev,stream,&local_60);
      pLVar6 = pLVar3;
    } while (pLVar3 != &pLVar1->link);
  }
  object = local_48;
  pLVar6 = (pLVar2->link).next;
  while (pLVar6 != &pLVar2->link) {
    pLVar3 = pLVar6->next;
    iVar5 = findPointer(pLVar6[-5].next,local_60.frames,local_60.numFrames);
    if (iVar5 < 0) {
      return false;
    }
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar5);
    Light::streamWrite((Light *)&pLVar6[-6].prev,stream);
    pLVar6 = pLVar3;
  }
  pLVar6 = ((LLLink *)&local_50->next)->next;
  if (pLVar6 != local_50) {
    do {
      pLVar3 = pLVar6->next;
      iVar5 = findPointer(pLVar6[-0x22].next,local_60.frames,local_60.numFrames);
      if (iVar5 < 0) {
        return false;
      }
      writeChunkHeader(stream,1,4);
      Stream::writeI32(stream,iVar5);
      Camera::streamWrite((Camera *)&pLVar6[-0x23].prev,stream);
      pLVar6 = pLVar3;
    } while (pLVar3 != local_50);
  }
  (*DAT_00148850)(local_60.frames);
  PluginList::streamWrite((PluginList *)&s_plglist,stream,object);
  return true;
}

Assistant:

bool
Clump::streamWrite(Stream *stream)
{
	int size = this->streamGetSize();
	writeChunkHeader(stream, ID_CLUMP, size);
	int32 numAtomics = this->countAtomics();
	int32 numLights = this->countLights();
	int32 numCameras = this->countCameras();
	int32 buf[3] = { numAtomics, numLights, numCameras };
	size = version > 0x33000 ? 12 : 4;
	writeChunkHeader(stream, ID_STRUCT, size);
	stream->write32(buf, size);

	FrameList_ frmlst;
	frmlst.numFrames = this->getFrame()->count();
	frmlst.frames = (Frame**)rwMalloc(frmlst.numFrames*sizeof(Frame*), MEMDUR_FUNCTION | ID_CLUMP);
	makeFrameList(this->getFrame(), frmlst.frames);
	frmlst.streamWrite(stream);

	if(rw::version >= 0x30400){
		size = 12+4;
		FORLIST(lnk, this->atomics)
			size += 12 + Atomic::fromClump(lnk)->geometry->streamGetSize();
		writeChunkHeader(stream, ID_GEOMETRYLIST, size);
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(numAtomics);	// same as numGeometries
		FORLIST(lnk, this->atomics)
			Atomic::fromClump(lnk)->geometry->streamWrite(stream);
	}

	FORLIST(lnk, this->atomics)
		Atomic::fromClump(lnk)->streamWriteClump(stream, &frmlst);

	FORLIST(lnk, this->lights){
		Light *l = Light::fromClump(lnk);
		int frm = findPointer(l->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		l->streamWrite(stream);
	}

	FORLIST(lnk, this->cameras){
		Camera *c = Camera::fromClump(lnk);
		int frm = findPointer(c->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		c->streamWrite(stream);
	}

	rwFree(frmlst.frames);

	s_plglist.streamWrite(stream, this);
	return true;
}